

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>
                   (string *__return_storage_ptr__,char (*a) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [67],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [93],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
                   char (*args_8) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
                   char (*args_10) [13])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_458;
  cmAlphaNum local_420;
  cmAlphaNum local_3e8;
  cmAlphaNum local_3b0;
  cmAlphaNum local_378;
  cmAlphaNum local_340;
  cmAlphaNum local_308;
  cmAlphaNum local_2d0;
  cmAlphaNum local_298;
  cmAlphaNum local_260;
  cmAlphaNum local_228;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_180;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [93];
  char (*args_local_2) [93];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [67];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [24];
  
  local_38 = args_2;
  args_local_2 = (char (*) [93])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [67])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [24])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_1b8,*a);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_180,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1f0,(string *)args_local);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_168,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_1f0);
  cmAlphaNum::cmAlphaNum(&local_228,(char *)args_local_1);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_150,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_228);
  cmAlphaNum::cmAlphaNum(&local_260,(string *)args_local_2);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_138,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_260);
  cmAlphaNum::cmAlphaNum(&local_298,*local_38);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_120,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_298);
  cmAlphaNum::cmAlphaNum(&local_2d0,args_3);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_2d0);
  cmAlphaNum::cmAlphaNum(&local_308,*args_4);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_308);
  cmAlphaNum::cmAlphaNum(&local_340,args_5);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_340);
  cmAlphaNum::cmAlphaNum(&local_378,*args_6);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_378);
  cmAlphaNum::cmAlphaNum(&local_3b0,args_7);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_3b0);
  cmAlphaNum::cmAlphaNum(&local_3e8,*args_8);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_3e8);
  cmAlphaNum::cmAlphaNum(&local_420,args_9);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_420);
  cmAlphaNum::cmAlphaNum(&local_458,*args_10);
  cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&,char_const(&)[93],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[13]>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],std::__cxx11::string_const&,char_const&[])
              ::makePair,&local_458);
  local_48 = &local_180;
  local_40 = 0xd;
  views._M_len = 0xd;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}